

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template.cc
# Opt level: O2

void __thiscall
ctemplate::TemplateTemplateNode::DumpToString(TemplateTemplateNode *this,int level,string *out)

{
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  if (out != (string *)0x0) {
    std::__cxx11::string::string((string *)&local_38,"Template Node: ",&local_59);
    std::__cxx11::string::string((string *)&local_58,"\n",&local_5a);
    AppendTokenWithIndent(level,out,&local_38,&this->token_,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    return;
  }
  __assert_fail("out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template.cc"
                ,0x480,
                "virtual void ctemplate::TemplateTemplateNode::DumpToString(int, string *) const");
}

Assistant:

virtual void DumpToString(int level, string *out) const {
    assert(out);
    AppendTokenWithIndent(level, out, "Template Node: ", token_, "\n");
  }